

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall Fossilize::ScratchAllocator::reset(ScratchAllocator *this)

{
  Impl *this_00;
  pointer pBVar1;
  const_iterator __cbeg;
  pointer pBVar2;
  pointer puVar3;
  ulong uVar4;
  Block *block;
  pointer pBVar5;
  
  this_00 = this->impl;
  pBVar2 = (this_00->blocks).
           super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this_00->blocks).
           super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar2 != pBVar1) {
    puVar3 = (pointer)0x0;
    pBVar5 = pBVar2;
    do {
      puVar3 = (pBVar5->blob).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish +
               ((long)puVar3 -
               (long)(pBVar5->blob).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar1);
    if ((pointer)this_00->peak_history_size < puVar3) {
      this_00->peak_history_size = (size_t)puVar3;
    }
    uVar4 = (long)pBVar1 - (long)pBVar2;
    if (uVar4 != 0) {
      if (0x20 < uVar4) {
        std::
        vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
        ::_M_erase(&this_00->blocks,pBVar2 + 1,(Block *)(uVar4 + (long)pBVar2));
        pBVar2 = (this->impl->blocks).
                 super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pBVar2->offset = 0;
    }
  }
  return;
}

Assistant:

void ScratchAllocator::reset()
{
	// Keep track of how large the buffer can grow.
	size_t peak = get_peak_memory_consumption();
	if (peak > impl->peak_history_size)
		impl->peak_history_size = peak;

	if (impl->blocks.size() > 0)
	{
		// free all but first block
		if (impl->blocks.size() > 1)
			impl->blocks.erase(impl->blocks.begin() + 1, impl->blocks.end());
		// reset offset on first block
		impl->blocks[0].offset = 0;
	}
}